

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::lazyPrintGroupInfo(ConsoleReporter *this)

{
  GroupInfo *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __rhs = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentGroupInfo.
          super_Option<Catch::GroupInfo>.nullableValue;
  if (((__rhs->name)._M_string_length != 0) && (1 < __rhs->groupsCounts)) {
    std::operator+(&local_30,"Group: ",&__rhs->name);
    printClosedHeader(this,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    (this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentGroupInfo.used = true;
  }
  return;
}

Assistant:

T* operator->() { return nullableValue; }